

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O2

VARTYPE __thiscall Node::GetNodeVarType(Node *this)

{
  int iVar1;
  VARTYPE VVar2;
  VARTYPE VVar3;
  VariableStruct *pVVar4;
  ulong uVar5;
  VARTYPE VVar6;
  
  VVar6 = 0x80000000;
LAB_001079ca:
  iVar1 = this->Type;
  switch(iVar1) {
  case 0x1ba:
    VVar2 = VARTYPE_WORD;
    goto LAB_00107a82;
  case 0x1bb:
  case 0x1bc:
  case 0x1bd:
  case 0x1be:
  case 0x1bf:
  case 0x1c0:
  case 0x1c1:
  case 0x1c2:
  case 0x1c3:
  case 0x1c4:
  case 0x1c5:
  case 0x1c6:
  case 0x1c7:
  case 0x1c8:
  case 0x1c9:
  case 0x1ca:
  case 0x1cb:
  case 0x1cc:
  case 0x1d1:
  case 0x1d2:
  case 0x1d5:
  case 0x1d6:
  case 0x1d7:
  case 0x1d8:
  case 0x1d9:
  case 0x1da:
  case 0x1db:
  case 0x1dc:
  case 0x1e9:
  case 0x1ef:
    goto switchD_001079e0_caseD_1bb;
  case 0x1cd:
  case 0x1d3:
    pVVar4 = VariableList::Lookup(Variables,&this->TextValue,this->Tree[0],0);
    VVar2 = VARTYPE_NONE;
    if (pVVar4 != (VariableStruct *)0x0) {
      VVar2 = pVVar4->Type;
    }
    goto LAB_00107a82;
  case 0x1ce:
switchD_001079e0_caseD_1ce:
    VVar2 = VARTYPE_REAL;
    goto LAB_00107a82;
  case 0x1cf:
  case 0x1d0:
  case 0x1dd:
  case 0x1de:
  case 0x1df:
  case 0x1e0:
  case 0x1e1:
  case 0x1e2:
  case 0x1e3:
  case 0x1e4:
  case 0x1e5:
  case 0x1e6:
  case 0x1e7:
  case 0x1e8:
  case 0x1ea:
  case 0x1eb:
  case 0x1ec:
  case 0x1ed:
  case 0x1ee:
    goto switchD_001079e0_caseD_1cf;
  case 0x1d4:
switchD_001079e0_caseD_1d4:
    VVar2 = VARTYPE_DYNSTR;
    goto LAB_00107a82;
  case 0x1f0:
  case 0x1f1:
  case 0x1f2:
  case 499:
  case 500:
    break;
  case 0x1f5:
    VVar2 = VARTYPE_NONE;
    if ((this->Tree[0] != (Node *)0x0) && (this->Tree[1] != (Node *)0x0)) {
      VVar3 = GetNodeVarType(this->Tree[0]);
      VVar2 = GetNodeVarType(this->Tree[1]);
      if ((int)VVar2 < (int)VVar3) {
        VVar2 = VVar3;
      }
    }
    goto LAB_00107a82;
  default:
    uVar5 = (ulong)(iVar1 - 0x23U);
    if (iVar1 - 0x23U < 0x3c) {
      if ((0x21UL >> (uVar5 & 0x3f) & 1) != 0) break;
      if ((0x800000000001580U >> (uVar5 & 0x3f) & 1) != 0) {
        VVar2 = GetNodeVarType(this->Tree[0]);
        this = this->Tree[1];
        if ((int)VVar6 < (int)VVar2) {
          VVar6 = VVar2;
        }
        goto LAB_001079ca;
      }
      if ((0xe000000UL >> (uVar5 & 0x3f) & 1) != 0) goto switchD_001079e0_caseD_1cf;
    }
    if (iVar1 == 0x10f) break;
    if (iVar1 == 0x110) {
      VVar2 = VARTYPE_BYTE;
      goto LAB_00107a82;
    }
    if (iVar1 == 0x123) {
      VVar2 = VARTYPE_DECIMAL;
      goto LAB_00107a82;
    }
    VVar2 = VARTYPE_DOUBLE;
    if (iVar1 == 300) goto LAB_00107a82;
    if (iVar1 != 0x131) {
      if ((iVar1 == 0x149) || (iVar1 == 0x14f)) {
        VVar2 = VARTYPE_GFLOAT;
        goto LAB_00107a82;
      }
      if (iVar1 != 0x157) {
        if (iVar1 == 0x15f) {
          VVar2 = VARTYPE_LONG;
          goto LAB_00107a82;
        }
        if (iVar1 == 0x182) goto switchD_001079e0_caseD_1ce;
        if (iVar1 == 0x1a0) goto switchD_001079e0_caseD_1d4;
        goto switchD_001079e0_caseD_1bb;
      }
    }
switchD_001079e0_caseD_1cf:
    VVar2 = VARTYPE_INTEGER;
    goto LAB_00107a82;
  }
  this = this->Tree[0];
  if (this == (Node *)0x0) {
switchD_001079e0_caseD_1bb:
    VVar2 = VARTYPE_NONE;
LAB_00107a82:
    if ((int)VVar6 < (int)VVar2) {
      VVar6 = VVar2;
    }
    return VVar6;
  }
  goto LAB_001079ca;
}

Assistant:

VARTYPE Node::GetNodeVarType(void)
{
	VariableStruct *ThisVar;

	//
	// Handle this node type
	//
	switch (Type)
	{
	//
	// Takes the type of the rvalue
	//
	case '#':
	case '(':
	case BAS_N_ASSIGN:
	case BAS_N_ASSIGNLIST:
	case BAS_S_BY:
	case BAS_N_FORASSIGN:
	case BAS_N_UMINUS:
	case BAS_N_UPLUS:
		if (Tree[0] != 0)
		{
			return Tree[0]->GetNodeVarType();
		}
		break;

	//
	// Takes the 'higher' of the two types
	//
	case '+':
	case '-':
	case '*':
	case '/':
	case '^':
		return ChooseVarType(Tree[0]->GetNodeVarType(),
			Tree[1]->GetNodeVarType());

	case BAS_N_LIST:
		if ((Tree[0] != 0) && (Tree[1] != 0))
		{
			return ChooseVarType(Tree[0]->GetNodeVarType(),
				Tree[1]->GetNodeVarType());
		}
		break;
	//
	// Always an integer
	//
	case '=':
	case '>':
	case '<':
	case BAS_X_LAND:
	case BAS_S_AND:
	case BAS_S_EQV:
	case BAS_S_IMP:
	case BAS_S_ERL:
	case BAS_X_GE:
	case BAS_V_INT:
	case BAS_V_INTEGER:
	case BAS_X_LE:
	case BAS_X_NEQ:
	case BAS_S_NOT:
	case BAS_X_LNOT:
	case BAS_X_LOR:
	case BAS_S_OR:
	case BAS_X_UNARYGT:
	case BAS_X_UNARYGE:
	case BAS_X_UNARYLE:
	case BAS_X_UNARYLT:
	case BAS_X_UNARYNEQ:
	case BAS_S_XOR:
	case BAS_S_INTEGER:
		return VARTYPE_INTEGER;

	//
	// Always a floating point
	//
	case BAS_V_FLOAT:
		return VARTYPE_REAL;

	//
	// Always a string
	//
	case BAS_V_TEXTSTRING:
		return VARTYPE_DYNSTR;

	//
	// Function references
	//
	case BAS_V_FUNCTION:
	case BAS_V_NAME:
		//
		// Look for variable in table
		//
		ThisVar = Variables->Lookup(TextValue, Tree[0]);

		//
		// Print this variable
		//
		if (ThisVar != 0)
		{
			return ThisVar->Type;
		}
		break;

	case BAS_S_BYTE:
		return VARTYPE_BYTE;

	case BAS_S_DOUBLE:
		return VARTYPE_DOUBLE;

	case BAS_S_GFLOAT:
		return VARTYPE_GFLOAT;

	case BAS_S_HFLOAT:
		return VARTYPE_GFLOAT;

	case BAS_S_LONG:
		return VARTYPE_LONG;

	case BAS_S_WORD:
		return VARTYPE_WORD;

	case BAS_S_REAL:
		return VARTYPE_REAL;

	case BAS_S_STRING:
		return VARTYPE_DYNSTR;

	case BAS_S_DECIMAL:
		return VARTYPE_DECIMAL;

	//
	// Gonna havta handle these at some time, but for now ...
	//
	case BAS_V_PREDEF:
	case BAS_X_STRREF:
	case BAS_N_STRUCTNAME:
	case BAS_N_TYPEFUN:
	case BAS_N_VARTYPE:
	case BAS_S_RFA:

//**		return Type;

		break;
	}

	//
	// I don't know!
	//
	return VARTYPE_NONE;
}